

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_hostcheck.c
# Opt level: O0

int amqp_raw_nequal(char *first,char *second,size_t max)

{
  char cVar1;
  char cVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  bool bVar3;
  long local_20;
  char *local_18;
  char *local_10;
  uint local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    bVar3 = false;
    if ((*local_10 != '\0') && (bVar3 = false, *local_18 != '\0')) {
      bVar3 = local_20 != 0;
    }
    if (!bVar3) break;
    cVar1 = amqp_raw_toupper(*local_10);
    cVar2 = amqp_raw_toupper(*local_18);
    if (cVar1 != cVar2) break;
    local_20 = local_20 + -1;
    local_10 = local_10 + 1;
    local_18 = local_18 + 1;
  }
  if (local_20 == 0) {
    local_4 = 1;
  }
  else {
    cVar1 = amqp_raw_toupper(*local_10);
    cVar2 = amqp_raw_toupper(*local_18);
    local_4 = (uint)(cVar1 == cVar2);
  }
  return local_4;
}

Assistant:

static int
amqp_raw_nequal(const char *first, const char *second, size_t max)
{
  while (*first && *second && max) {
    if (amqp_raw_toupper(*first) != amqp_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if (0 == max) {
    return 1; /* they are equal this far */
  }
  return amqp_raw_toupper(*first) == amqp_raw_toupper(*second);
}